

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5ConfigParseRank(char *zIn,char **pzRank,char **pzRankArgs)

{
  char *pcVar1;
  long lVar2;
  char *__dest;
  char *pcVar3;
  char *p;
  char *pcVar4;
  char *pcVar5;
  int rc;
  int local_34;
  
  local_34 = 0;
  *pzRank = (char *)0x0;
  *pzRankArgs = (char *)0x0;
  if (zIn == (char *)0x0) {
    local_34 = 1;
    __dest = (char *)0x0;
  }
  else {
    do {
      pcVar5 = zIn;
      zIn = pcVar5 + 1;
    } while (*pcVar5 == ' ');
    lVar2 = -1;
    while (((long)zIn[lVar2] < 0 || ((&DAT_001dc110)[zIn[lVar2]] != '\0'))) {
      lVar2 = lVar2 + 1;
    }
    pcVar4 = zIn + lVar2;
    if (lVar2 == -1) {
      local_34 = 1;
      pcVar4 = (char *)0x0;
LAB_001a1a5b:
      __dest = (char *)0x0;
    }
    else {
      __dest = (char *)sqlite3Fts5MallocZero(&local_34,((long)pcVar4 - (long)pcVar5) + 1);
      if (__dest == (char *)0x0) goto LAB_001a1a5b;
      memcpy(__dest,pcVar5,(long)pcVar4 - (long)pcVar5);
    }
    if (local_34 == 0) {
      do {
        pcVar5 = pcVar4;
        pcVar4 = pcVar5 + 1;
      } while (*pcVar5 == ' ');
      if (*pcVar5 != '(') {
        local_34 = 1;
      }
    }
    if (local_34 == 0) {
      if (pcVar4 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar4 = pcVar4 + -1;
        do {
          pcVar5 = pcVar4 + 1;
          pcVar3 = pcVar4 + 1;
          pcVar4 = pcVar5;
        } while (*pcVar3 == ' ');
      }
      pcVar4 = pcVar5;
      if (*pcVar5 != ')') {
        do {
          if (*pcVar4 != ' ') {
            pcVar4 = fts5ConfigSkipLiteral(pcVar4);
            if (pcVar4 == (char *)0x0) {
              pcVar4 = (char *)0x0;
            }
            else {
              pcVar3 = pcVar4 + -1;
              do {
                pcVar4 = pcVar3 + 1;
                pcVar1 = pcVar3 + 1;
                pcVar3 = pcVar4;
              } while (*pcVar1 == ' ');
            }
            if (pcVar4 == (char *)0x0) goto LAB_001a1aee;
            if (*pcVar4 != ',') goto LAB_001a1ae9;
          }
          pcVar4 = pcVar4 + 1;
        } while( true );
      }
    }
  }
  goto LAB_001a1b27;
LAB_001a1ae9:
  if (*pcVar4 != ')') {
LAB_001a1aee:
    pcVar4 = (char *)0x0;
  }
  if (pcVar4 == (char *)0x0) {
    local_34 = 1;
  }
  else {
    pcVar3 = (char *)sqlite3Fts5MallocZero(&local_34,((long)pcVar4 - (long)pcVar5) + 1);
    if (pcVar3 != (char *)0x0) {
      memcpy(pcVar3,pcVar5,(long)pcVar4 - (long)pcVar5);
      goto LAB_001a1b29;
    }
  }
LAB_001a1b27:
  pcVar3 = (char *)0x0;
LAB_001a1b29:
  if (local_34 == 0) {
    *pzRank = __dest;
    *pzRankArgs = pcVar3;
  }
  else {
    sqlite3_free(__dest);
  }
  return local_34;
}

Assistant:

static int sqlite3Fts5ConfigParseRank(
  const char *zIn,                /* Input string */
  char **pzRank,                  /* OUT: Rank function name */
  char **pzRankArgs               /* OUT: Rank function arguments */
){
  const char *p = zIn;
  const char *pRank;
  char *zRank = 0;
  char *zRankArgs = 0;
  int rc = SQLITE_OK;

  *pzRank = 0;
  *pzRankArgs = 0;

  if( p==0 ){
    rc = SQLITE_ERROR;
  }else{
    p = fts5ConfigSkipWhitespace(p);
    pRank = p;
    p = fts5ConfigSkipBareword(p);

    if( p ){
      zRank = sqlite3Fts5MallocZero(&rc, 1 + p - pRank);
      if( zRank ) memcpy(zRank, pRank, p-pRank);
    }else{
      rc = SQLITE_ERROR;
    }

    if( rc==SQLITE_OK ){
      p = fts5ConfigSkipWhitespace(p);
      if( *p!='(' ) rc = SQLITE_ERROR;
      p++;
    }
    if( rc==SQLITE_OK ){
      const char *pArgs; 
      p = fts5ConfigSkipWhitespace(p);
      pArgs = p;
      if( *p!=')' ){
        p = fts5ConfigSkipArgs(p);
        if( p==0 ){
          rc = SQLITE_ERROR;
        }else{
          zRankArgs = sqlite3Fts5MallocZero(&rc, 1 + p - pArgs);
          if( zRankArgs ) memcpy(zRankArgs, pArgs, p-pArgs);
        }
      }
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3_free(zRank);
    assert( zRankArgs==0 );
  }else{
    *pzRank = zRank;
    *pzRankArgs = zRankArgs;
  }
  return rc;
}